

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZQuadTorus.h
# Opt level: O2

void __thiscall
pzgeom::TPZQuadTorus::X<double>
          (TPZQuadTorus *this,TPZFMatrix<double> *nodes,TPZVec<double> *loc,TPZVec<double> *result)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  TPZManVector<double,_2> resloc;
  
  TPZManVector<double,_2>::TPZManVector(&resloc,2);
  TPZGeoQuad::X<double>
            (&(this->fPhiTheta).super_TPZFMatrix<double>,loc,&resloc.super_TPZVec<double>);
  dVar1 = this->fR;
  dVar4 = this->fr;
  dVar2 = cos(*resloc.super_TPZVec<double>.fStore);
  dVar3 = cos(resloc.super_TPZVec<double>.fStore[1]);
  *result->fStore = dVar3 * (dVar2 * dVar4 + dVar1);
  dVar1 = this->fR;
  dVar4 = this->fr;
  dVar2 = cos(*resloc.super_TPZVec<double>.fStore);
  dVar3 = sin(resloc.super_TPZVec<double>.fStore[1]);
  result->fStore[1] = dVar3 * (dVar2 * dVar4 + dVar1);
  dVar1 = this->fr;
  dVar4 = sin(*resloc.super_TPZVec<double>.fStore);
  result->fStore[2] = dVar4 * dVar1;
  TPZManVector<double,_2>::~TPZManVector(&resloc);
  return;
}

Assistant:

void X(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc,TPZVec<T> &result) const
        {
            TPZManVector<T,2> resloc(2);
            TPZGeoQuad::X(this->fPhiTheta,loc,resloc);
            
            result[0] = (fR + fr*cos(resloc[0]))*cos(resloc[1]);
            result[1] = (fR + fr*cos(resloc[0]))*sin(resloc[1]);
            result[2] = fr*sin(resloc[0]);
            
        }